

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles2::Functional::getCompressedTexSubImage2DFormat
               (vector<int,_std::allocator<int>_> *supported,
               vector<int,_std::allocator<int>_> *accepted)

{
  iterator __position;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __args;
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  GLuint *pGVar4;
  
  piVar2 = (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)piVar1 - (long)piVar2) >> 2)) {
    pGVar4 = getCompressedTexSubImage2DFormat::compressedTexSubImage2DFormats;
    lVar3 = 0;
    do {
      __args = std::
               __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                         (piVar2,piVar1,pGVar4);
      if (__args._M_current !=
          (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_finish) {
        __position._M_current =
             (accepted->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (accepted->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)accepted,__position,__args._M_current);
        }
        else {
          *__position._M_current = *__args._M_current;
          (accepted->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      lVar3 = lVar3 + 1;
      piVar2 = (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (supported->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pGVar4 = pGVar4 + 1;
    } while (lVar3 < (int)((ulong)((long)piVar1 - (long)piVar2) >> 2));
  }
  return;
}

Assistant:

static void getCompressedTexSubImage2DFormat(const vector<deInt32>& supported, vector<deInt32>& accepted)
{
	// Find a supported compressed texture format that is accepted by compressedTexSubImage2D()

	static const GLuint compressedTexSubImage2DFormats[] =
	{
		0x83F0,	// GL_COMPRESSED_RGB_S3TC_DXT1_EXT
		0x83F1,	// GL_COMPRESSED_RGBA_S3TC_DXT1_EXT
		0x8C00,	// GL_COMPRESSED_RGB_PVRTC_4BPPV1_IMG
		0x8C01,	// GL_COMPRESSED_RGB_PVRTC_2BPPV1_IMG
		0x8C02,	// GL_COMPRESSED_RGBA_PVRTC_4BPPV1_IMG
		0x8C03	// GL_COMPRESSED_RGBA_PVRTC_2BPPV1_IMG
	};

	for (int i = 0; i < (int)supported.size(); i++)
	{
		vector<deInt32>::const_iterator fmt = std::find(supported.begin(), supported.end(), compressedTexSubImage2DFormats[i]);
		if (fmt != supported.end())
			accepted.push_back(*fmt);
	}
}